

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateInterfaceProperty
          (cmExportFileGenerator *this,string *propName,cmTarget *target,
          ImportPropertyMap *properties)

{
  char *pcVar1;
  mapped_type *this_00;
  char *input;
  ImportPropertyMap *properties_local;
  cmTarget *target_local;
  string *propName_local;
  cmExportFileGenerator *this_local;
  
  pcVar1 = cmTarget::GetProperty(target,propName);
  if (pcVar1 != (char *)0x0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](properties,propName);
    std::__cxx11::string::operator=((string *)this_00,pcVar1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::PopulateInterfaceProperty(
                                              const std::string& propName,
                                              cmTarget *target,
                                              ImportPropertyMap &properties)
{
  const char *input = target->GetProperty(propName);
  if (input)
    {
    properties[propName] = input;
    }
}